

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

ssize_t fio_flush(intptr_t uuid)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  fio_data_s *pfVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ssize_t sVar11;
  fio_lock_i ret;
  fio_str_info_s local_60;
  fio_str_info_s local_48;
  
  pfVar5 = fio_data;
  if (uuid < 0) {
LAB_0012cbe7:
    piVar7 = __errno_location();
    *piVar7 = 9;
  }
  else {
    uVar10 = (uint)((ulong)uuid >> 8);
    if (fio_data->capa <= uVar10) goto LAB_0012cbe7;
    lVar9 = (long)(int)uVar10 * 0xa8;
    if (*(char *)((long)fio_data + lVar9 + 0x6d) != (char)uuid) goto LAB_0012cbe7;
    piVar7 = __errno_location();
    *piVar7 = 0;
    LOCK();
    pcVar1 = (char *)((long)pfVar5 + lVar9 + 0x6e);
    cVar2 = *pcVar1;
    *pcVar1 = '\x01';
    UNLOCK();
    if (cVar2 == '\0') {
      lVar8 = *(long *)((long)fio_data + lVar9 + 0x40);
      if (lVar8 == 0) {
        lVar8 = (**(code **)(*(long *)((long)fio_data + lVar9 + 0xa8) + 0x10))
                          (uuid,*(undefined8 *)((long)fio_data + lVar9 + 0xb0));
        LOCK();
        *(undefined1 *)((long)fio_data + lVar9 + 0x6e) = 0;
        UNLOCK();
        if (lVar8 == 0) {
          return 0;
        }
        if (-1 < lVar8) {
          *(__time_t *)((long)fio_data + lVar9 + 0x60) = (fio_data->last_cycle).tv_sec;
          return 1;
        }
LAB_0012ccf2:
        LOCK();
        *(undefined1 *)((long)fio_data + lVar9 + 0x6e) = 0;
        UNLOCK();
        iVar6 = *piVar7;
        sVar11 = 1;
        if (iVar6 < 0x1c) {
          switch(iVar6) {
          case 4:
          case 0xb:
            goto switchD_0012cd5c_caseD_4;
          case 5:
          case 9:
            break;
          case 6:
          case 7:
          case 8:
          case 10:
          case 0xc:
          case 0xd:
switchD_0012cd5c_caseD_6:
            fprintf(_stderr,"UUID error: %p (%d)\n",uuid);
            perror("No errno handler");
            return 0;
          case 0xe:
            if (1 < FIO_LOG_LEVEL) {
              FIO_LOG2STDERR(
                            "ERROR: fio_flush EFAULT - possible memory address error sent to Unix socket."
                            );
            }
            break;
          default:
            if (iVar6 != 0x16) goto switchD_0012cd5c_caseD_6;
          }
        }
        else {
          if ((iVar6 - 99U < 0x11) && ((0x10101U >> (iVar6 - 99U & 0x1f) & 1) != 0)) {
            return 1;
          }
          if (iVar6 == 0x1c) {
            return 1;
          }
          if (iVar6 != 0x20) goto switchD_0012cd5c_caseD_6;
        }
        *(undefined1 *)((long)fio_data + lVar9 + 0x70) = 1;
      }
      else {
        uVar3 = *(ulong *)((long)fio_data + lVar9 + 0x50);
        iVar6 = (**(code **)(lVar8 + 8))((ulong)uuid >> 8 & 0xffffffff);
        if (iVar6 < 1) goto LAB_0012ccf2;
        if ((((0x3ff < *(ushort *)((long)fio_data + lVar9 + 0x68)) &&
             (*(long *)((long)fio_data + lVar9 + 0x40) == lVar8)) &&
            (uVar4 = *(ulong *)((long)fio_data + lVar9 + 0x50), uVar3 <= uVar4)) &&
           (uVar4 - uVar3 < 0x8000)) {
          if (2 < FIO_LOG_LEVEL) {
            fio_peer_addr(&local_48,uuid);
            fio_peer_addr(&local_60,uuid);
            FIO_LOG2STDERR("WARNING: (facil.io) possible Slowloris attack from %.*s",
                           (ulong)(uint)local_48.len,local_60.data);
          }
          LOCK();
          *(undefined1 *)((long)fio_data + lVar9 + 0x6e) = 0;
          UNLOCK();
          fio_clear_fd((long)(int)uVar10,'\0');
          goto LAB_0012cbf2;
        }
        LOCK();
        *(undefined1 *)((long)fio_data + lVar9 + 0x6e) = 0;
        UNLOCK();
        lVar8 = *(long *)((long)fio_data + lVar9 + 0x40);
        if ((lVar8 != 0) || (*(char *)((long)fio_data + lVar9 + 0x70) == '\0')) {
          if (*(char *)((long)fio_data + lVar9 + 0x6f) == '\0') {
            return 0;
          }
          return (ulong)(lVar8 != 0);
        }
      }
      fio_force_close(uuid);
    }
    else {
      *piVar7 = 0xb;
    }
  }
LAB_0012cbf2:
  sVar11 = -1;
switchD_0012cd5c_caseD_4:
  return sVar11;
}

Assistant:

ssize_t fio_flush(intptr_t uuid) {
  if (!uuid_is_valid(uuid))
    goto invalid;
  errno = 0;
  ssize_t flushed = 0;
  int tmp;
  /* start critical section */
  if (fio_trylock(&uuid_data(uuid).sock_lock))
    goto would_block;

  if (!uuid_data(uuid).packet)
    goto flush_rw_hook;

  const fio_packet_s *old_packet = uuid_data(uuid).packet;
  const size_t old_sent = uuid_data(uuid).sent;

  tmp = uuid_data(uuid).packet->write_func(fio_uuid2fd(uuid),
                                           uuid_data(uuid).packet);
  if (tmp <= 0) {
    goto test_errno;
  }

  if (uuid_data(uuid).packet_count >= FIO_SLOWLORIS_LIMIT &&
      uuid_data(uuid).packet == old_packet &&
      uuid_data(uuid).sent >= old_sent &&
      (uuid_data(uuid).sent - old_sent) < 32768) {
    /* Slowloris attack assumed */
    goto attacked;
  }

  /* end critical section */
  fio_unlock(&uuid_data(uuid).sock_lock);

  /* test for fio_close marker */
  if (!uuid_data(uuid).packet && uuid_data(uuid).close)
    goto closed;

  /* return state */
  return uuid_data(uuid).open && uuid_data(uuid).packet != NULL;

would_block:
  errno = EWOULDBLOCK;
  return -1;

closed:
  fio_force_close(uuid);
  return -1;

flush_rw_hook:
  flushed = uuid_data(uuid).rw_hooks->flush(uuid, uuid_data(uuid).rw_udata);
  fio_unlock(&uuid_data(uuid).sock_lock);
  if (!flushed)
    return 0;
  if (flushed < 0) {
    goto test_errno;
  }
  touchfd(fio_uuid2fd(uuid));
  return 1;

test_errno:
  fio_unlock(&uuid_data(uuid).sock_lock);
  switch (errno) {
  case EWOULDBLOCK: /* fallthrough */
#if EWOULDBLOCK != EAGAIN
  case EAGAIN: /* fallthrough */
#endif
  case ENOTCONN:      /* fallthrough */
  case EINPROGRESS:   /* fallthrough */
  case ENOSPC:        /* fallthrough */
  case EADDRNOTAVAIL: /* fallthrough */
  case EINTR:
    return 1;
  case EFAULT:
    FIO_LOG_ERROR("fio_flush EFAULT - possible memory address error sent to "
                  "Unix socket.");
    /* fallthrough */
  case EPIPE:  /* fallthrough */
  case EIO:    /* fallthrough */
  case EINVAL: /* fallthrough */
  case EBADF:
    uuid_data(uuid).close = 1;
    fio_force_close(uuid);
    return -1;
  }
  fprintf(stderr, "UUID error: %p (%d)\n", (void *)uuid, errno);
  perror("No errno handler");
  return 0;

invalid:
  /* bad UUID */
  errno = EBADF;
  return -1;

attacked:
  /* don't close, just detach from facil.io and mark uuid as invalid */
  FIO_LOG_WARNING("(facil.io) possible Slowloris attack from %.*s",
                  (int)fio_peer_addr(uuid).len, fio_peer_addr(uuid).data);
  fio_unlock(&uuid_data(uuid).sock_lock);
  fio_clear_fd(fio_uuid2fd(uuid), 0);
  return -1;
}